

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void Curl_http_method(Curl_easy *data,connectdata *conn,char **method,Curl_HttpReq *reqp)

{
  char *local_38;
  char *request;
  Curl_HttpReq httpreq;
  Curl_HttpReq *reqp_local;
  char **method_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  request._4_4_ = (Curl_HttpReq)(data->state).httpreq;
  if (((conn->handler->protocol & 7) != 0) &&
     ((*(ulong *)&(data->set).field_0x8e2 >> 0x1a & 1) != 0)) {
    request._4_4_ = HTTPREQ_PUT;
  }
  if ((data->set).str[6] == (char *)0x0) {
    if ((*(ulong *)&(data->set).field_0x8e2 >> 0x19 & 1) == 0) {
      switch(request._4_4_) {
      default:
        local_38 = "GET";
        break;
      case HTTPREQ_POST:
      case HTTPREQ_POST_FORM:
      case HTTPREQ_POST_MIME:
        local_38 = "POST";
        break;
      case HTTPREQ_PUT:
        local_38 = "PUT";
        break;
      case HTTPREQ_HEAD:
        local_38 = "HEAD";
      }
    }
    else {
      local_38 = "HEAD";
    }
  }
  else {
    local_38 = (data->set).str[6];
  }
  *method = local_38;
  *reqp = request._4_4_;
  return;
}

Assistant:

void Curl_http_method(struct Curl_easy *data, struct connectdata *conn,
                      const char **method, Curl_HttpReq *reqp)
{
  Curl_HttpReq httpreq = (Curl_HttpReq)data->state.httpreq;
  const char *request;
  if((conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_FTP)) &&
     data->set.upload)
    httpreq = HTTPREQ_PUT;

  /* Now set the 'request' pointer to the proper request string */
  if(data->set.str[STRING_CUSTOMREQUEST])
    request = data->set.str[STRING_CUSTOMREQUEST];
  else {
    if(data->set.opt_no_body)
      request = "HEAD";
    else {
      DEBUGASSERT((httpreq >= HTTPREQ_GET) && (httpreq <= HTTPREQ_HEAD));
      switch(httpreq) {
      case HTTPREQ_POST:
      case HTTPREQ_POST_FORM:
      case HTTPREQ_POST_MIME:
        request = "POST";
        break;
      case HTTPREQ_PUT:
        request = "PUT";
        break;
      default: /* this should never happen */
      case HTTPREQ_GET:
        request = "GET";
        break;
      case HTTPREQ_HEAD:
        request = "HEAD";
        break;
      }
    }
  }
  *method = request;
  *reqp = httpreq;
}